

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O1

int subprocess::util::read_all(FILE *fp,vector<char,_std::allocator<char>_> *buf)

{
  long lVar1;
  pointer pcVar2;
  int iVar3;
  char cVar4;
  int __fd;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  pointer pcVar8;
  bool bVar9;
  int iVar10;
  pointer pcVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long in_FS_OFFSET;
  int local_58;
  int local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar11 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  uVar13 = (ulong)(uint)(*(int *)&(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (int)pcVar11);
  local_58 = 0;
  do {
    __fd = fileno((FILE *)fp);
    iVar14 = 0;
    iVar10 = 0;
    do {
      sVar6 = read(__fd,pcVar11 + iVar14,(long)(int)uVar13 - (long)iVar14);
      bVar9 = true;
      iVar5 = (int)sVar6;
      iVar3 = iVar14;
      if (iVar5 != 0) {
        iVar3 = local_54;
        if (iVar5 == -1) {
          piVar7 = __errno_location();
          if (iVar10 < 0x32 && *piVar7 == 4) {
            iVar10 = iVar10 + 1;
            bVar9 = false;
          }
          else {
            local_54 = -1;
            iVar3 = local_54;
          }
        }
        else {
          iVar14 = iVar14 + iVar5;
          bVar9 = false;
        }
      }
      local_54 = iVar3;
    } while (!bVar9);
    if (local_54 == -1) {
      cVar4 = (local_58 != 0) * '\x02' + '\x01';
    }
    else {
      uVar12 = (int)uVar13 - local_54;
      uVar13 = (ulong)uVar12;
      if (uVar12 == 0) {
        uVar13 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        std::vector<char,_std::allocator<char>_>::resize(buf,uVar13 * 2);
        local_58 = local_58 + local_54;
        pcVar11 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start + local_58;
        cVar4 = '\0';
      }
      else {
        local_58 = local_58 + local_54;
        cVar4 = '\x03';
      }
    }
  } while (cVar4 == '\0');
  if (cVar4 == '\x03') {
    pcVar8 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start + local_58;
    pcVar11 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
    if ((pcVar8 != pcVar11) &&
       (pcVar2 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
       pcVar2 != pcVar8 + ((long)pcVar2 - (long)pcVar11))) {
      (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pcVar8 + ((long)pcVar2 - (long)pcVar11);
    }
  }
  else {
    local_58 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

static inline int read_all(FILE* fp, std::vector<char>& buf)
  {
    auto buffer = buf.data();
    int total_bytes_read = 0;
    int fill_sz = buf.size();

    while (1) {
      const int rd_bytes = read_atmost_n(fp, buffer, fill_sz);

      if (rd_bytes == -1) { // Read finished
        if (total_bytes_read == 0) return -1;
        break;

      } else if (rd_bytes == fill_sz) { // Buffer full
        const auto orig_sz = buf.size();
        const auto new_sz = orig_sz * 2;
        buf.resize(new_sz);
        fill_sz = new_sz - orig_sz;

        //update the buffer pointer
        buffer = buf.data();
        total_bytes_read += rd_bytes;
        buffer += total_bytes_read;

      } else { // Partial data ? Continue reading
        total_bytes_read += rd_bytes;
        fill_sz -= rd_bytes;
        break;
      }
    }
    buf.erase(buf.begin()+total_bytes_read, buf.end()); // remove extra nulls
    return total_bytes_read;
  }